

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O0

void Cec2_ObjAddToFrontier(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Ptr_t *vFrontier,satoko_t *pSat)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar;
  satoko_t *pSat_local;
  Vec_Ptr_t *vFrontier_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Gia_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/cec/cecSat.c"
                  ,0x131,
                  "void Cec2_ObjAddToFrontier(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
  }
  iVar1 = Gia_ObjIsConst0(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Gia_ObjIsConst0(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/cec/cecSat.c"
                  ,0x132,
                  "void Cec2_ObjAddToFrontier(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
  }
  iVar1 = Cec2_ObjSatId(p,pObj);
  if (iVar1 < 0) {
    iVar1 = Cec2_ObjSatId(p,pObj);
    if (iVar1 != -1) {
      __assert_fail("Cec2_ObjSatId(p, pObj) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/cec/cecSat.c"
                    ,0x135,
                    "void Cec2_ObjAddToFrontier(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)")
      ;
    }
    iVar1 = satoko_add_variable(pSat,'\0');
    if (p->vVar2Obj != (Vec_Int_t *)0x0) {
      iVar2 = Vec_IntSize(p->vVar2Obj);
      if (iVar2 != iVar1) {
        __assert_fail("Vec_IntSize(p->vVar2Obj) == iVar",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/cec/cecSat.c"
                      ,0x139,
                      "void Cec2_ObjAddToFrontier(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)"
                     );
      }
      p_00 = p->vVar2Obj;
      iVar2 = Gia_ObjId(p,pObj);
      Vec_IntPush(p_00,iVar2);
    }
    Cec2_ObjSetSatId(p,pObj,iVar1);
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 != 0) {
      Vec_PtrPush(vFrontier,pObj);
    }
  }
  return;
}

Assistant:

void Cec2_ObjAddToFrontier( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Ptr_t * vFrontier, satoko_t * pSat )
{
    int iVar;
    assert( !Gia_IsComplement(pObj) );
    assert( !Gia_ObjIsConst0(pObj) );
    if ( Cec2_ObjSatId(p, pObj) >= 0 )
        return;
    assert( Cec2_ObjSatId(p, pObj) == -1 );
    iVar = satoko_add_variable(pSat, 0);
    if ( p->vVar2Obj )
    {
        assert( Vec_IntSize(p->vVar2Obj) == iVar );
        Vec_IntPush( p->vVar2Obj, Gia_ObjId(p, pObj) );
    }
    Cec2_ObjSetSatId( p, pObj, iVar );
    if ( Gia_ObjIsAnd(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}